

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9VmInstallForeignFunction
                (jx9_vm *pVm,SyString *pName,ProcHostFunction xFunc,void *pUserData)

{
  SyHashEntry *pSVar1;
  sxi32 rc;
  SyHashEntry *pEntry;
  jx9_user_func *pFunc;
  void *pUserData_local;
  ProcHostFunction xFunc_local;
  SyString *pName_local;
  jx9_vm *pVm_local;
  
  pFunc = (jx9_user_func *)pUserData;
  pUserData_local = xFunc;
  xFunc_local = (ProcHostFunction)pName;
  pName_local = (SyString *)pVm;
  pSVar1 = SyHashGet(&pVm->hHostFunction,pName->zString,pName->nByte);
  if (pSVar1 == (SyHashEntry *)0x0) {
    pVm_local._4_4_ =
         jx9NewForeignFunction
                   ((jx9_vm *)pName_local,(SyString *)xFunc_local,(ProcHostFunction)pUserData_local,
                    pFunc,(jx9_user_func **)&pEntry);
    if (pVm_local._4_4_ == 0) {
      pVm_local._4_4_ =
           SyHashInsert((SyHash *)(pName_local + 0x2c),*(void **)&pEntry->nKeyLen,
                        *(sxu32 *)(xFunc_local + 8),pEntry);
      if (pVm_local._4_4_ == 0) {
        pVm_local._4_4_ = 0;
      }
      else {
        SyMemBackendFree((SyMemBackend *)pName_local,*(void **)&pEntry->nKeyLen);
        SyMemBackendPoolFree((SyMemBackend *)pName_local,pEntry);
      }
    }
  }
  else {
    pEntry = (SyHashEntry *)pSVar1->pUserData;
    *(jx9_user_func **)&pEntry[1].nKeyLen = pFunc;
    pEntry[1].pKey = pUserData_local;
    SySetReset((SySet *)&pEntry[1].pUserData);
    pVm_local._4_4_ = 0;
  }
  return pVm_local._4_4_;
}

Assistant:

JX9_PRIVATE sxi32 jx9VmInstallForeignFunction(
	jx9_vm *pVm,              /* Target VM */
	const SyString *pName,    /* Foreign function name */
	ProcHostFunction xFunc,  /* Foreign function implementation */
	void *pUserData           /* Foreign function private data */
	)
{
	jx9_user_func *pFunc;
	SyHashEntry *pEntry;
	sxi32 rc;
	/* Overwrite any previously registered function with the same name */
	pEntry = SyHashGet(&pVm->hHostFunction, pName->zString, pName->nByte);
	if( pEntry ){
		pFunc = (jx9_user_func *)pEntry->pUserData;
		pFunc->pUserData = pUserData;
		pFunc->xFunc = xFunc;
		SySetReset(&pFunc->aAux);
		return SXRET_OK;
	}
	/* Create a new user function */
	rc = jx9NewForeignFunction(&(*pVm), &(*pName), xFunc, pUserData, &pFunc);
	if( rc != SXRET_OK ){
		return rc;
	}
	/* Install the function in the corresponding hashtable */
	rc = SyHashInsert(&pVm->hHostFunction, SyStringData(&pFunc->sName), pName->nByte, pFunc);
	if( rc != SXRET_OK ){
		SyMemBackendFree(&pVm->sAllocator, (void *)SyStringData(&pFunc->sName));
		SyMemBackendPoolFree(&pVm->sAllocator, pFunc);
		return rc;
	}
	/* User function successfully installed */
	return SXRET_OK;
}